

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O2

void __thiscall
check_computations_of_values_on_different_points::test_method
          (check_computations_of_values_on_different_points *this)

{
  size_t i;
  long lVar1;
  double x;
  double dVar2;
  double local_a0;
  vector<double,_std::allocator<double>_> results_level_10;
  vector<double,_std::allocator<double>_> results_level_0;
  Persistence_landscape_on_grid p;
  
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&p,"data/file_with_diagram_1",100,0xffff);
  results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f846fb26a75ea93;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3faab8ec45381875;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fbab430f49491f3;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fc405f6ba0620ab;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fcab1d4f9c1f85d;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fd0aed99cbee808;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fd404c8bc9cd3e1;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fd75ab7dc7abfba;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fdab0a6fc58ab93;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fdb789e774eebf6;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            (&results_level_0,(double *)&results_level_10);
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a0 = 7.21433e-05;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.0422135;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.0943335;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.146453;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.198573;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.240715;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.272877;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.324997;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.359232;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  local_a0 = 0.379344;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&results_level_10,&local_a0);
  x = 0.0012321;
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    dVar2 = Gudhi::Persistence_representations::Persistence_landscape_on_grid::
            compute_value_at_a_given_point(&p,0,x);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
              (dVar2,results_level_0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar1],epsilon);
    dVar2 = Gudhi::Persistence_representations::Persistence_landscape_on_grid::
            compute_value_at_a_given_point(&p,10,x);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
              (dVar2,results_level_10.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar1],epsilon);
    x = x + 0.05212;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&results_level_10.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&results_level_0.super__Vector_base<double,_std::allocator<double>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&p.values_of_landscapes);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_computations_of_values_on_different_points) {
  Persistence_landscape_on_grid p("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());

  std::vector<double> results_level_0;
  results_level_0.push_back(0.00997867);
  results_level_0.push_back(0.0521921);
  results_level_0.push_back(0.104312);
  results_level_0.push_back(0.156432);
  results_level_0.push_back(0.208552);
  results_level_0.push_back(0.260672);
  results_level_0.push_back(0.312792);
  results_level_0.push_back(0.364912);
  results_level_0.push_back(0.417032);
  results_level_0.push_back(0.429237);

  std::vector<double> results_level_10;
  results_level_10.push_back(7.21433e-05);
  results_level_10.push_back(0.0422135);
  results_level_10.push_back(0.0943335);
  results_level_10.push_back(0.146453);
  results_level_10.push_back(0.198573);
  results_level_10.push_back(0.240715);
  results_level_10.push_back(0.272877);
  results_level_10.push_back(0.324997);
  results_level_10.push_back(0.359232);
  results_level_10.push_back(0.379344);

  double x = 0.0012321;
  double dx = 0.05212;
  for (size_t i = 0; i != 10; ++i) {
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.compute_value_at_a_given_point(0, x), results_level_0[i], epsilon);
    GUDHI_TEST_FLOAT_EQUALITY_CHECK(p.compute_value_at_a_given_point(10, x), results_level_10[i], epsilon);
    x += dx;
  }
}